

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_x509.cc
# Opt level: O0

int X509_print_ex(BIO *bp,X509 *x,ulong nmflag,ulong cflag)

{
  X509 *pXVar1;
  int iVar2;
  char *pcVar3;
  X509_NAME *pXVar4;
  ASN1_TIME *pAVar5;
  EVP_PKEY *pkey_00;
  char local_72;
  bool local_71;
  EVP_PKEY *pkey;
  int i;
  char *neg;
  uint64_t serial_u64;
  ASN1_INTEGER *serial;
  long l;
  X509_CINF *ci;
  int nmindent;
  char mlch;
  unsigned_long cflag_local;
  unsigned_long nmflags_local;
  X509 *x_local;
  BIO *bp_local;
  
  ci._7_1_ = ' ';
  ci._0_4_ = 0;
  if ((nmflag & 0xf0000) == 0x40000) {
    ci._7_1_ = '\n';
    ci._0_4_ = 0xc;
  }
  if (nmflag == 0) {
    ci._0_4_ = 0x10;
  }
  l = (long)x->cert_info;
  _nmindent = cflag;
  cflag_local = nmflag;
  nmflags_local = (unsigned_long)x;
  x_local = (X509 *)bp;
  if ((cflag & 1) == 0) {
    iVar2 = BIO_write(bp,"Certificate:\n",0xd);
    if (iVar2 < 1) {
      return 0;
    }
    iVar2 = BIO_write((BIO *)x_local,"    Data:\n",10);
    if (iVar2 < 1) {
      return 0;
    }
  }
  if ((_nmindent & 2) == 0) {
    serial = (ASN1_INTEGER *)X509_get_version((X509 *)nmflags_local);
    local_71 = (ASN1_INTEGER *)0x2 < serial;
    if (local_71) {
      __assert_fail("X509_VERSION_1 <= l && l <= X509_VERSION_3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/t_x509.cc"
                    ,0x49,"int X509_print_ex(BIO *, X509 *, unsigned long, unsigned long)");
    }
    iVar2 = BIO_printf((BIO *)x_local,"%8sVersion: %ld (0x%lx)\n","",
                       (undefined1 *)((long)&serial->length + 1),serial);
    if (iVar2 < 1) {
      return 0;
    }
  }
  if ((_nmindent & 4) == 0) {
    iVar2 = BIO_write((BIO *)x_local,"        Serial Number:",0x16);
    if (iVar2 < 1) {
      return 0;
    }
    serial_u64 = (uint64_t)X509_get0_serialNumber((X509 *)nmflags_local);
    iVar2 = ASN1_INTEGER_get_uint64((uint64_t *)&neg,(ASN1_INTEGER *)serial_u64);
    if (iVar2 == 0) {
      ERR_clear_error();
      pcVar3 = "";
      if (*(int *)(serial_u64 + 4) == 0x102) {
        pcVar3 = " (Negative)";
      }
      iVar2 = BIO_printf((BIO *)x_local,"\n%12s%s","",pcVar3);
      if (iVar2 < 1) {
        return 0;
      }
      for (pkey._4_4_ = 0; pkey._4_4_ < *(int *)serial_u64; pkey._4_4_ = pkey._4_4_ + 1) {
        local_72 = '\n';
        if (pkey._4_4_ + 1 != *(int *)serial_u64) {
          local_72 = ':';
        }
        iVar2 = BIO_printf((BIO *)x_local,"%02x%c",
                           (ulong)*(byte *)(*(long *)(serial_u64 + 8) + (long)pkey._4_4_),
                           (ulong)(uint)(int)local_72);
        if (iVar2 < 1) {
          return 0;
        }
      }
    }
    else {
      if (*(int *)(serial_u64 + 4) == 0x102) {
        __assert_fail("serial->type != V_ASN1_NEG_INTEGER",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/t_x509.cc"
                      ,0x57,"int X509_print_ex(BIO *, X509 *, unsigned long, unsigned long)");
      }
      iVar2 = BIO_printf((BIO *)x_local," %lu (0x%lx)\n",neg,neg);
      if (iVar2 < 1) {
        return 0;
      }
    }
  }
  if (((_nmindent & 8) == 0) &&
     (iVar2 = X509_signature_print((BIO *)x_local,*(X509_ALGOR **)(l + 0x10),(ASN1_STRING *)0x0),
     iVar2 < 1)) {
    return 0;
  }
  if ((_nmindent & 0x10) == 0) {
    iVar2 = BIO_printf((BIO *)x_local,"        Issuer:%c",(ulong)(uint)(int)ci._7_1_);
    pXVar1 = x_local;
    if (iVar2 < 1) {
      return 0;
    }
    pXVar4 = X509_get_issuer_name((X509 *)nmflags_local);
    iVar2 = X509_NAME_print_ex((BIO *)pXVar1,pXVar4,(int)ci,cflag_local);
    if (iVar2 < 0) {
      return 0;
    }
    iVar2 = BIO_write((BIO *)x_local,"\n",1);
    if (iVar2 < 1) {
      return 0;
    }
  }
  if ((_nmindent & 0x20) == 0) {
    iVar2 = BIO_write((BIO *)x_local,"        Validity\n",0x11);
    if (iVar2 < 1) {
      return 0;
    }
    iVar2 = BIO_write((BIO *)x_local,"            Not Before: ",0x18);
    pXVar1 = x_local;
    if (iVar2 < 1) {
      return 0;
    }
    pAVar5 = X509_get_notBefore((X509 *)nmflags_local);
    iVar2 = ASN1_TIME_print((BIO *)pXVar1,(ASN1_TIME *)pAVar5);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = BIO_write((BIO *)x_local,"\n            Not After : ",0x19);
    pXVar1 = x_local;
    if (iVar2 < 1) {
      return 0;
    }
    pAVar5 = X509_get_notAfter((X509 *)nmflags_local);
    iVar2 = ASN1_TIME_print((BIO *)pXVar1,(ASN1_TIME *)pAVar5);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = BIO_write((BIO *)x_local,"\n",1);
    if (iVar2 < 1) {
      return 0;
    }
  }
  if ((_nmindent & 0x40) == 0) {
    iVar2 = BIO_printf((BIO *)x_local,"        Subject:%c",(ulong)(uint)(int)ci._7_1_);
    pXVar1 = x_local;
    if (iVar2 < 1) {
      return 0;
    }
    pXVar4 = X509_get_subject_name((X509 *)nmflags_local);
    iVar2 = X509_NAME_print_ex((BIO *)pXVar1,pXVar4,(int)ci,cflag_local);
    if (iVar2 < 0) {
      return 0;
    }
    iVar2 = BIO_write((BIO *)x_local,"\n",1);
    if (iVar2 < 1) {
      return 0;
    }
  }
  if ((_nmindent & 0x80) == 0) {
    iVar2 = BIO_write((BIO *)x_local,"        Subject Public Key Info:\n",0x21);
    if (iVar2 < 1) {
      return 0;
    }
    iVar2 = BIO_printf((BIO *)x_local,"%12sPublic Key Algorithm: ","");
    if (iVar2 < 1) {
      return 0;
    }
    iVar2 = i2a_ASN1_OBJECT((BIO *)x_local,*(ASN1_OBJECT **)**(undefined8 **)(l + 0x30));
    if (iVar2 < 1) {
      return 0;
    }
    iVar2 = BIO_puts((BIO *)x_local,"\n");
    if (iVar2 < 1) {
      return 0;
    }
    pkey_00 = (EVP_PKEY *)X509_get0_pubkey((X509 *)nmflags_local);
    if (pkey_00 == (EVP_PKEY *)0x0) {
      BIO_printf((BIO *)x_local,"%12sUnable to load Public Key\n","");
      ERR_print_errors((BIO *)x_local);
    }
    else {
      EVP_PKEY_print_public((BIO *)x_local,pkey_00,0x10,(ASN1_PCTX *)0x0);
    }
  }
  if ((_nmindent & 0x1000) == 0) {
    if (*(long *)(l + 0x38) != 0) {
      iVar2 = BIO_printf((BIO *)x_local,"%8sIssuer Unique ID: ","");
      if (iVar2 < 1) {
        return 0;
      }
      iVar2 = X509_signature_dump((BIO *)x_local,*(ASN1_STRING **)(l + 0x38),0xc);
      if (iVar2 == 0) {
        return 0;
      }
    }
    if (*(long *)(l + 0x40) != 0) {
      iVar2 = BIO_printf((BIO *)x_local,"%8sSubject Unique ID: ","");
      if (iVar2 < 1) {
        return 0;
      }
      iVar2 = X509_signature_dump((BIO *)x_local,*(ASN1_STRING **)(l + 0x40),0xc);
      if (iVar2 == 0) {
        return 0;
      }
    }
  }
  if ((_nmindent & 0x100) == 0) {
    X509V3_extensions_print
              ((BIO *)x_local,"X509v3 extensions",*(stack_st_X509_EXTENSION **)(l + 0x48),_nmindent,
               8);
  }
  if (((_nmindent & 0x200) == 0) &&
     (iVar2 = X509_signature_print
                        ((BIO *)x_local,*(X509_ALGOR **)(nmflags_local + 8),
                         *(ASN1_STRING **)(nmflags_local + 0x10)), iVar2 < 1)) {
    bp_local._4_4_ = 0;
  }
  else if (((_nmindent & 0x400) == 0) &&
          (iVar2 = X509_CERT_AUX_print((BIO *)x_local,*(X509_CERT_AUX **)(nmflags_local + 0x88),0),
          iVar2 == 0)) {
    bp_local._4_4_ = 0;
  }
  else {
    bp_local._4_4_ = 1;
  }
  return bp_local._4_4_;
}

Assistant:

int X509_print_ex(BIO *bp, X509 *x, unsigned long nmflags,
                  unsigned long cflag) {
  char mlch = ' ';
  int nmindent = 0;
  if ((nmflags & XN_FLAG_SEP_MASK) == XN_FLAG_SEP_MULTILINE) {
    mlch = '\n';
    nmindent = 12;
  }

  if (nmflags == X509_FLAG_COMPAT) {
    nmindent = 16;
  }

  const X509_CINF *ci = x->cert_info;
  if (!(cflag & X509_FLAG_NO_HEADER)) {
    if (BIO_write(bp, "Certificate:\n", 13) <= 0) {
      return 0;
    }
    if (BIO_write(bp, "    Data:\n", 10) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_VERSION)) {
    long l = X509_get_version(x);
    assert(X509_VERSION_1 <= l && l <= X509_VERSION_3);
    if (BIO_printf(bp, "%8sVersion: %ld (0x%lx)\n", "", l + 1,
                   (unsigned long)l) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_SERIAL)) {
    if (BIO_write(bp, "        Serial Number:", 22) <= 0) {
      return 0;
    }

    const ASN1_INTEGER *serial = X509_get0_serialNumber(x);
    uint64_t serial_u64;
    if (ASN1_INTEGER_get_uint64(&serial_u64, serial)) {
      assert(serial->type != V_ASN1_NEG_INTEGER);
      if (BIO_printf(bp, " %" PRIu64 " (0x%" PRIx64 ")\n", serial_u64,
                     serial_u64) <= 0) {
        return 0;
      }
    } else {
      ERR_clear_error();  // Clear |ASN1_INTEGER_get_uint64|'s error.
      const char *neg =
          (serial->type == V_ASN1_NEG_INTEGER) ? " (Negative)" : "";
      if (BIO_printf(bp, "\n%12s%s", "", neg) <= 0) {
        return 0;
      }

      for (int i = 0; i < serial->length; i++) {
        if (BIO_printf(bp, "%02x%c", serial->data[i],
                       ((i + 1 == serial->length) ? '\n' : ':')) <= 0) {
          return 0;
        }
      }
    }
  }

  if (!(cflag & X509_FLAG_NO_SIGNAME)) {
    if (X509_signature_print(bp, ci->signature, NULL) <= 0) {
      return 0;
    }
  }

  if (!(cflag & X509_FLAG_NO_ISSUER)) {
    if (BIO_printf(bp, "        Issuer:%c", mlch) <= 0) {
      return 0;
    }
    if (X509_NAME_print_ex(bp, X509_get_issuer_name(x), nmindent, nmflags) <
        0) {
      return 0;
    }
    if (BIO_write(bp, "\n", 1) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_VALIDITY)) {
    if (BIO_write(bp, "        Validity\n", 17) <= 0) {
      return 0;
    }
    if (BIO_write(bp, "            Not Before: ", 24) <= 0) {
      return 0;
    }
    if (!ASN1_TIME_print(bp, X509_get_notBefore(x))) {
      return 0;
    }
    if (BIO_write(bp, "\n            Not After : ", 25) <= 0) {
      return 0;
    }
    if (!ASN1_TIME_print(bp, X509_get_notAfter(x))) {
      return 0;
    }
    if (BIO_write(bp, "\n", 1) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_SUBJECT)) {
    if (BIO_printf(bp, "        Subject:%c", mlch) <= 0) {
      return 0;
    }
    if (X509_NAME_print_ex(bp, X509_get_subject_name(x), nmindent, nmflags) <
        0) {
      return 0;
    }
    if (BIO_write(bp, "\n", 1) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_PUBKEY)) {
    if (BIO_write(bp, "        Subject Public Key Info:\n", 33) <= 0) {
      return 0;
    }
    if (BIO_printf(bp, "%12sPublic Key Algorithm: ", "") <= 0) {
      return 0;
    }
    if (i2a_ASN1_OBJECT(bp, ci->key->algor->algorithm) <= 0) {
      return 0;
    }
    if (BIO_puts(bp, "\n") <= 0) {
      return 0;
    }

    const EVP_PKEY *pkey = X509_get0_pubkey(x);
    if (pkey == NULL) {
      BIO_printf(bp, "%12sUnable to load Public Key\n", "");
      ERR_print_errors(bp);
    } else {
      EVP_PKEY_print_public(bp, pkey, 16, NULL);
    }
  }

  if (!(cflag & X509_FLAG_NO_IDS)) {
    if (ci->issuerUID) {
      if (BIO_printf(bp, "%8sIssuer Unique ID: ", "") <= 0) {
        return 0;
      }
      if (!X509_signature_dump(bp, ci->issuerUID, 12)) {
        return 0;
      }
    }
    if (ci->subjectUID) {
      if (BIO_printf(bp, "%8sSubject Unique ID: ", "") <= 0) {
        return 0;
      }
      if (!X509_signature_dump(bp, ci->subjectUID, 12)) {
        return 0;
      }
    }
  }

  if (!(cflag & X509_FLAG_NO_EXTENSIONS)) {
    X509V3_extensions_print(bp, "X509v3 extensions", ci->extensions, cflag, 8);
  }

  if (!(cflag & X509_FLAG_NO_SIGDUMP)) {
    if (X509_signature_print(bp, x->sig_alg, x->signature) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_AUX)) {
    if (!X509_CERT_AUX_print(bp, x->aux, 0)) {
      return 0;
    }
  }

  return 1;
}